

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O0

int ptr_cas(elem_ptr_t *ptr,ll_elem **expect,ll_elem *set)

{
  ll_elem *fl;
  ll_elem *plVar1;
  ll_elem *plVar2;
  ll_elem *plVar3;
  bool bVar4;
  uintptr_t set_;
  int succes;
  ll_elem *old;
  ll_elem *set_local;
  ll_elem **expect_local;
  elem_ptr_t *ptr_local;
  
  fl = *expect;
  if (((ulong)fl & 1) == 0) {
    plVar2 = flag_combine(set,fl);
    plVar2 = ptr_ref(plVar2);
    while( true ) {
      plVar1 = *expect;
      LOCK();
      plVar3 = (ll_elem *)*ptr;
      bVar4 = plVar1 == plVar3;
      if (bVar4) {
        *ptr = (elem_ptr_t)plVar2;
        plVar3 = plVar1;
      }
      UNLOCK();
      if (!bVar4) {
        *expect = plVar3;
      }
      if ((bVar4 != 0) || ((ll_elem *)((ulong)*expect & 0xfffffffffffffffe) != fl)) break;
      *expect = fl;
    }
    return (uint)bVar4;
  }
  __assert_fail("!((uintptr_t)old & DEREF)",
                "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0xdb,
                "int ptr_cas(elem_ptr_t *, struct ll_elem **, struct ll_elem *)");
}

Assistant:

static __inline int
ptr_cas(elem_ptr_t *ptr, struct ll_elem **expect, struct ll_elem *set)
{
	struct ll_elem	*old = *expect;
	int		 succes;
	uintptr_t	 set_;

	assert(!((uintptr_t)old & DEREF));
	set_ = (uintptr_t)ptr_ref(flag_combine(set, old));

	for (;;) {
		succes = atomic_compare_exchange_weak_explicit(ptr,
		    (uintptr_t*)expect, set_,
		    memory_order_acq_rel, memory_order_relaxed);
		if (succes)
			break;
		if (((uintptr_t)*expect & ~DEREF) != (uintptr_t)old)
			break;
		*expect = old;
		SPINWAIT();
	}

	return succes;
}